

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

void __thiscall Samba::Samba(Samba *this)

{
  Samba *this_local;
  
  this->_vptr_Samba = (_func_int **)&PTR__Samba_00128508;
  this->_canChipErase = false;
  this->_canWriteBuffer = false;
  this->_canChecksumBuffer = false;
  this->_readBufferSize = 0;
  this->_debug = false;
  this->_isUsb = false;
  std::unique_ptr<SerialPort,std::default_delete<SerialPort>>::
  unique_ptr<std::default_delete<SerialPort>,void>
            ((unique_ptr<SerialPort,std::default_delete<SerialPort>> *)&this->_port);
  return;
}

Assistant:

Samba::Samba() :
    _canChipErase(false),
    _canWriteBuffer(false),
    _canChecksumBuffer(false),
    _readBufferSize(0),
    _debug(false),
    _isUsb(false)
{
}